

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,ArrayPtr<const_char> *first,
          CappedArray<char,_14UL> *rest,ArrayPtr<const_char> *rest_1,StringTree *rest_2,
          ArrayPtr<const_char> *rest_3,ArrayPtr<const_char> *rest_4,ArrayPtr<const_char> *rest_5,
          ArrayPtr<const_char> *rest_6,ArrayPtr<const_char> *rest_7,String *rest_8,
          ArrayPtr<const_char> *rest_9,ArrayPtr<const_char> *rest_10,ArrayPtr<const_char> *rest_11,
          String *rest_12,ArrayPtr<const_char> *rest_13,CappedArray<char,_14UL> *rest_14,
          ArrayPtr<const_char> *rest_15,StringTree *rest_16,ArrayPtr<const_char> *rest_17,
          ArrayPtr<const_char> *rest_18,ArrayPtr<const_char> *rest_19,ArrayPtr<const_char> *rest_20,
          ArrayPtr<const_char> *rest_21,String *rest_22,ArrayPtr<const_char> *rest_23,
          ArrayPtr<const_char> *rest_24,ArrayPtr<const_char> *rest_25,String *rest_26,
          ArrayPtr<const_char> *rest_27,CappedArray<char,_14UL> *rest_28,
          ArrayPtr<const_char> *rest_29,StringTree *rest_30,ArrayPtr<const_char> *rest_31,
          String *rest_32,ArrayPtr<const_char> *rest_33,ArrayPtr<const_char> *rest_34,
          ArrayPtr<const_char> *rest_35,ArrayPtr<const_char> *rest_36,ArrayPtr<const_char> *rest_37,
          ArrayPtr<const_char> *rest_38,ArrayPtr<const_char> *rest_39,String *rest_40,
          ArrayPtr<const_char> *rest_41,CappedArray<char,_14UL> *rest_42,
          ArrayPtr<const_char> *rest_43)

{
  size_t sVar1;
  
  sVar1 = first->size_;
  if (sVar1 != 0) {
    memcpy(pos,first->ptr,sVar1);
    pos = pos + sVar1;
  }
  sVar1 = rest->currentSize;
  if (sVar1 != 0) {
    memcpy(pos,rest->content,sVar1);
    pos = pos + sVar1;
  }
  sVar1 = rest_1->size_;
  if (sVar1 != 0) {
    memcpy(pos,rest_1->ptr,sVar1);
    pos = pos + sVar1;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,rest_9,rest_10,
             rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,rest_18,rest_19,rest_20,rest_21
             ,rest_22,rest_23,rest_24,rest_25,rest_26,rest_27,rest_28,rest_29,rest_30,rest_31,
             rest_32,rest_33,rest_34,rest_35,rest_36,rest_37,rest_38,rest_39,rest_40,rest_41,rest_42
             ,rest_43);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}